

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::EndDragDropSource(void)

{
  ImGuiContext *pIVar1;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  if ((GImGui->DragDropActive & 1U) == 0) {
    __assert_fail("g.DragDropActive",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x27df,"void ImGui::EndDragDropSource()");
  }
  if ((GImGui->DragDropWithinSource & 1U) == 0) {
    __assert_fail("g.DragDropWithinSource && \"Not after a BeginDragDropSource()?\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x27e0,"void ImGui::EndDragDropSource()");
  }
  if ((GImGui->DragDropSourceFlags & 1U) == 0) {
    EndTooltip();
  }
  if ((pIVar1->DragDropPayload).DataFrameCount == -1) {
    ClearDragDrop();
  }
  pIVar1->DragDropWithinSource = false;
  return;
}

Assistant:

void ImGui::EndDragDropSource()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.DragDropActive);
    IM_ASSERT(g.DragDropWithinSource && "Not after a BeginDragDropSource()?");

    if (!(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoPreviewTooltip))
        EndTooltip();

    // Discard the drag if have not called SetDragDropPayload()
    if (g.DragDropPayload.DataFrameCount == -1)
        ClearDragDrop();
    g.DragDropWithinSource = false;
}